

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputIterator.hpp
# Opt level: O3

KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_> __thiscall
supermap::io::
InputIterator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_6UL,_void>::
next(InputIterator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_6UL,_void>
     *this)

{
  istream *is;
  ByteArray<4UL> extraout_RDX;
  undefined8 *in_RSI;
  KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_> KVar1;
  undefined8 local_20;
  
  *(char *)(in_RSI + 1) = *(char *)(in_RSI + 1) + '\x01';
  is = (istream *)(*(code *)**(undefined8 **)*in_RSI)();
  std::istream::read((char *)is,(long)this);
  DeserializeHelper<supermap::ByteArray<4UL>,_void>::deserialize
            ((DeserializeHelper<supermap::ByteArray<4UL>,_void> *)&local_20,is);
  *(undefined8 *)&this->index_ = local_20;
  KVar1.value.data_._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
  ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       extraout_RDX.data_._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  KVar1._0_8_ = this;
  return KVar1;
}

Assistant:

T next() {
        ++index_;
        return deserialize<T>(input_->get());
    }